

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeAddExceptions(Unicode61Tokenizer *p,char *z,int bTokenChars)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  u32 iCode;
  byte *pbVar10;
  uint local_40;
  
  sVar5 = strlen(z);
  iVar9 = 0;
  uVar4 = (uint)sVar5;
  if (0 < (int)uVar4) {
    piVar6 = p->aiException;
    iVar2 = p->nException;
    iVar3 = sqlite3_initialize();
    iVar9 = 7;
    if ((iVar3 == 0) &&
       (piVar6 = (int *)sqlite3Realloc(piVar6,((long)iVar2 + (long)(int)uVar4) * 4),
       piVar6 != (int *)0x0)) {
      local_40 = p->nException;
      if ((sVar5 & 0x7fffffff) != 0) {
        pbVar10 = (byte *)(z + (uVar4 & 0x7fffffff));
        do {
          bVar1 = *z;
          uVar4 = (uint)bVar1;
          z = (char *)((byte *)z + 1);
          if (bVar1 < 0xc0) {
LAB_001d8155:
            iCode = uVar4;
            if (0x7f < uVar4) goto LAB_001d8168;
            p->aTokenChar[uVar4] = (uchar)bTokenChars;
          }
          else {
            uVar4 = (uint)""[bVar1 - 0xc0];
            for (; ((byte *)z != pbVar10 && (((byte)*z & 0xffffffc0) == 0x80));
                z = (char *)((byte *)z + 1)) {
              uVar4 = uVar4 << 6 | (byte)*z & 0x3f;
            }
            iCode = 0xfffd;
            if ((((uVar4 & 0xfffffffe) != 0xfffe) && (0x7f < uVar4)) &&
               ((uVar4 & 0xfffff800) != 0xd800)) goto LAB_001d8155;
LAB_001d8168:
            uVar4 = sqlite3Fts5UnicodeCategory(iCode);
            if ((uint)p->aCategory[uVar4] != bTokenChars) {
              if (0xffffffcd < iCode - 0x332) {
                uVar4 = 0x361f8;
                if (iCode < 800) {
                  uVar4 = 0x8029fdf;
                }
                if ((uVar4 >> (iCode - 0x20 & 0x1f) & 1) != 0) goto LAB_001d8203;
              }
              if ((int)local_40 < 1) {
                uVar8 = 0;
              }
              else {
                uVar7 = 0;
                do {
                  uVar8 = uVar7;
                  if (iCode < (uint)piVar6[uVar7]) break;
                  uVar7 = uVar7 + 1;
                  uVar8 = (ulong)local_40;
                } while (local_40 != uVar7);
              }
              uVar7 = uVar8 & 0xffffffff;
              memmove(piVar6 + uVar7 + 1,piVar6 + uVar7,(long)(int)(local_40 - (int)uVar8) << 2);
              piVar6[uVar7] = iCode;
              local_40 = local_40 + 1;
            }
          }
LAB_001d8203:
        } while (z < pbVar10);
      }
      p->aiException = piVar6;
      p->nException = local_40;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int fts5UnicodeAddExceptions(
  Unicode61Tokenizer *p,          /* Tokenizer object */
  const char *z,                  /* Characters to treat as exceptions */
  int bTokenChars                 /* 1 for 'tokenchars', 0 for 'separators' */
){
  int rc = SQLITE_OK;
  int n = (int)strlen(z);
  int *aNew;

  if( n>0 ){
    aNew = (int*)sqlite3_realloc64(p->aiException,
                                   (n+p->nException)*sizeof(int));
    if( aNew ){
      int nNew = p->nException;
      const unsigned char *zCsr = (const unsigned char*)z;
      const unsigned char *zTerm = (const unsigned char*)&z[n];
      while( zCsr<zTerm ){
        u32 iCode;
        int bToken;
        READ_UTF8(zCsr, zTerm, iCode);
        if( iCode<128 ){
          p->aTokenChar[iCode] = (unsigned char)bTokenChars;
        }else{
          bToken = p->aCategory[sqlite3Fts5UnicodeCategory(iCode)];
          assert( (bToken==0 || bToken==1) ); 
          assert( (bTokenChars==0 || bTokenChars==1) );
          if( bToken!=bTokenChars && sqlite3Fts5UnicodeIsdiacritic(iCode)==0 ){
            int i;
            for(i=0; i<nNew; i++){
              if( (u32)aNew[i]>iCode ) break;
            }
            memmove(&aNew[i+1], &aNew[i], (nNew-i)*sizeof(int));
            aNew[i] = iCode;
            nNew++;
          }
        }
      }
      p->aiException = aNew;
      p->nException = nNew;
    }else{
      rc = SQLITE_NOMEM;
    }
  }

  return rc;
}